

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_state.c
# Opt level: O0

lua_State * lj_state_new(lua_State *L)

{
  lua_State *L_00;
  lua_State *in_RDI;
  lua_State *unaff_retaddr;
  lua_State *L1;
  
  L_00 = (lua_State *)lj_mem_newgco(unaff_retaddr,(GCSize)((ulong)in_RDI >> 0x20));
  L_00->gct = '\x06';
  L_00->dummy_ffid = '\x01';
  L_00->status = '\0';
  L_00->stacksize = 0;
  (L_00->stack).ptr32 = 0;
  L_00->cframe = (void *)0x0;
  (L_00->openupval).gcptr32 = 0;
  (L_00->glref).ptr32 = (in_RDI->glref).ptr32;
  (L_00->env).gcptr32 = (in_RDI->env).gcptr32;
  stack_init(in_RDI,L_00);
  return L_00;
}

Assistant:

lua_State *lj_state_new(lua_State *L)
{
  lua_State *L1 = lj_mem_newobj(L, lua_State);
  L1->gct = ~LJ_TTHREAD;
  L1->dummy_ffid = FF_C;
  L1->status = LUA_OK;
  L1->stacksize = 0;
  setmref(L1->stack, NULL);
  L1->cframe = NULL;
  /* NOBARRIER: The lua_State is new (marked white). */
  setgcrefnull(L1->openupval);
  setmrefr(L1->glref, L->glref);
  setgcrefr(L1->env, L->env);
  stack_init(L1, L);  /* init stack */
  lj_assertL(iswhite(obj2gco(L1)), "new thread object is not white");
  return L1;
}